

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O3

int __thiscall soplex::LPColSetBase<double>::remove(LPColSetBase<double> *this,char *__filename)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int *piVar4;
  int extraout_EAX;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(this->super_SVSetBase<double>).set.thenum;
  SVSetBase<double>::remove(&this->super_SVSetBase<double>,__filename);
  if (0 < (long)uVar7) {
    pdVar1 = (this->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->up).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->scaleExp).data;
    uVar5 = 0;
    do {
      uVar6 = (ulong)*(uint *)(__filename + uVar5 * 4);
      if (uVar5 != uVar6 && -1 < (int)*(uint *)(__filename + uVar5 * 4)) {
        pdVar1[uVar6] = pdVar1[uVar5];
        pdVar2[uVar6] = pdVar2[uVar5];
        pdVar3[uVar6] = pdVar3[uVar5];
        piVar4[uVar6] = piVar4[uVar5];
      }
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  VectorBase<double>::reDim(&this->low,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->up,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
  DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum);
  return extraout_EAX;
}

Assistant:

void remove(int perm[])
   {
      int n = num();

      SVSetBase<R>::remove(perm);

      for(int i = 0; i < n; ++i)
      {
         if(perm[i] >= 0 && perm[i] != i)
         {
            low[perm[i]] = low[i];
            up[perm[i]] = up[i];
            object[perm[i]] = object[i];
            scaleExp[perm[i]] = scaleExp[i];
         }
      }

      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }